

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

Gia_Man_t * Gia_ManFromAigChoices(Aig_Man_t *p)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  int *piVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Gia_Man_t *pNew;
  Aig_Man_t *p_local;
  
  if (p->pEquivs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pEquivs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaAig.c"
                  ,0x8a,"Gia_Man_t *Gia_ManFromAigChoices(Aig_Man_t *)");
  }
  iVar1 = Aig_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nConstrs = p->nConstrs;
  iVar1 = Aig_ManObjNum(p);
  piVar3 = (int *)calloc((long)iVar1,4);
  p_00->pSibls = piVar3;
  Aig_ManCleanData(p);
  pAVar4 = Aig_ManConst1(p);
  (pAVar4->field_5).iData = 1;
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_24);
    iVar1 = Gia_ManAppendCi(p_00);
    *(int *)((long)pvVar5 + 0x28) = iVar1;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    pAVar4 = Aig_ObjFanin0(pAVar4);
    Gia_ManFromAigChoices_rec(p_00,p,pAVar4);
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
    iVar1 = Gia_ObjChild0Copy(pAVar4);
    Gia_ManAppendCo(p_00,iVar1);
  }
  iVar1 = Aig_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFromAigChoices( Aig_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( p->pEquivs != NULL );
    // create the new manager
    pNew = Gia_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create room to store equivalences
    pNew->pSibls = ABC_CALLOC( int, Aig_ManObjNum(p) );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->iData = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Gia_ManAppendCi( pNew );
    // add logic for the POs
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManFromAigChoices_rec( pNew, p, Aig_ObjFanin0(pObj) );        
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjChild0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    //assert( Gia_ManObjNum(pNew) == Aig_ManObjNum(p) );
    return pNew;
}